

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinatorProcessing.cpp
# Opt level: O0

tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool>
helics::processCoordinatorMessage
          (ActionMessage *cmd,TimeCoordinator *timeCoord,FederateStates state,bool timeGranted_mode,
          GlobalFederateId localID)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  MessageProcessingResult MVar4;
  action_t aVar5;
  int iVar6;
  char in_CL;
  ulong uVar7;
  TimeCoordinator *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar8;
  ActionMessage *in_RSI;
  _Tuple_impl<0UL,_helics::FederateStates,_helics::MessageProcessingResult,_bool> in_EDI;
  byte in_R8B;
  GlobalFederateId in_R9D;
  int32_t unaff_retaddr;
  TimeCoordinator *in_stack_00000008;
  GlobalFederateId in_stack_00000010;
  GlobalFederateId in_stack_00000014;
  MessageProcessingResult grant;
  bool processed_1;
  IterationRequest iterate;
  TimeProcessingResult processed;
  int32_t tid;
  BaseTimeCoordinator *in_stack_000000f0;
  size_t tidHash;
  bool returnable;
  MessageProcessingResult proc;
  bool newMode;
  undefined6 in_stack_00000100;
  FederateStates newState;
  id *in_stack_fffffffffffffed8;
  TimeCoordinator *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  char in_stack_fffffffffffffeef;
  Time *in_stack_fffffffffffffef0;
  ActionMessage *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  char local_b9;
  GlobalFederateId local_9c [2];
  undefined4 local_94;
  undefined4 local_90;
  TimeRepresentation<count_time<9,_long>_> local_88;
  GlobalFederateId local_7c;
  GlobalFederateId local_78;
  GlobalFederateId local_74;
  undefined4 local_70;
  GlobalFederateId local_6c [2];
  undefined4 local_64;
  GlobalFederateId local_5c;
  GlobalFederateId in_stack_ffffffffffffffa8;
  GlobalFederateId in_stack_ffffffffffffffac;
  GlobalFederateId in_stack_ffffffffffffffb0;
  uint uVar9;
  
  bVar1 = in_R8B & 1;
  bVar2 = false;
  aVar5 = ActionMessage::action(in_RSI);
  uVar7 = (ulong)(uint)aVar5;
  if (aVar5 == cmd_ignore) goto LAB_005bd2de;
  if ((aVar5 == cmd_disconnect) || (aVar5 == cmd_disconnect_fed)) {
    bVar2 = GlobalFederateId::operator==(&in_RSI->source_id,in_R9D);
    if (bVar2) {
      if ((in_CL != '\x05') && (in_CL != '\x03')) {
        BaseTimeCoordinator::disconnect(in_stack_000000f0);
        local_70 = 0;
        GlobalFederateId::GlobalFederateId(local_6c,(GlobalBrokerId)0x0);
        (in_RSI->dest_id).gid = local_6c[0].gid;
      }
    }
    else {
      (*(in_RDX->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])();
      if ((in_CL == '\x02') && (bVar1 == 0)) {
        memset(&local_74,0,4);
        GlobalFederateId::GlobalFederateId(&local_74);
        MVar4 = TimeCoordinator::checkTimeGrant
                          ((TimeCoordinator *)
                           CONCAT44(in_stack_ffffffffffffffac.gid,in_stack_ffffffffffffffa8.gid),
                           in_stack_ffffffffffffffb0);
        returnableResult(MVar4);
      }
    }
    goto LAB_005bd2de;
  }
  if ((uint)(aVar5 + (cmd_route_ack|cmd_disconnect_broker)) < 3) {
    bVar2 = false;
    iVar6 = (*(in_RDX->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])();
    if ((char)iVar6 == '\0') {
      bVar2 = true;
    }
    else if ((char)iVar6 == '\x05') {
      bVar2 = true;
    }
    if (((!bVar2) && (in_CL == '\x02')) && (bVar1 == 0)) {
      memset(&local_78,0,4);
      GlobalFederateId::GlobalFederateId(&local_78);
      MVar4 = TimeCoordinator::checkTimeGrant
                        ((TimeCoordinator *)
                         CONCAT44(in_stack_ffffffffffffffac.gid,in_stack_ffffffffffffffa8.gid),
                         in_stack_ffffffffffffffb0);
      returnableResult(MVar4);
    }
    goto LAB_005bd2de;
  }
  if (aVar5 == cmd_init_grant) {
    if (in_CL == '\0') {
      bVar2 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>(in_RSI,observer_flag);
      if ((bVar2) ||
         (bVar2 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                            (in_RSI,dynamic_join_flag), bVar2)) {
        TimeCoordinator::setDynamicJoining(in_RDX);
      }
      checkActionFlag<helics::ActionMessage,helics::TimingFlags>(in_RSI,iteration_requested_flag);
    }
    goto LAB_005bd2de;
  }
  if (aVar5 == cmd_exec_request) {
    bVar2 = GlobalFederateId::operator==(&in_RSI->source_id,in_R9D);
    if ((bVar2) &&
       (bVar2 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>(in_RSI,indicator_flag),
       bVar2)) {
      local_b9 = '\0';
      bVar2 = checkActionFlag<helics::ActionMessage,helics::TimingFlags>
                        (in_RSI,iteration_requested_flag);
      uVar8 = extraout_RDX;
      if (bVar2) {
        bVar2 = checkActionFlag<helics::ActionMessage,helics::InterfaceFlags>(in_RSI,required_flag);
        uVar7 = CONCAT71((int7)(uVar7 >> 8),bVar2);
        uVar8 = CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),2);
        local_b9 = '\x01';
        if (!bVar2) {
          local_b9 = '\x02';
        }
      }
      (*(in_RDX->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[10])
                (in_RDX,(ulong)(uint)(int)local_b9,uVar8,CONCAT71((int7)(uVar7 >> 8),local_b9));
      goto LAB_005bd2de;
    }
LAB_005bc9c8:
    uVar9 = 0;
    iVar6 = (*(in_RDX->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])();
    if ((char)iVar6 == '\0') {
      uVar9 = 0x10000;
    }
    else if ((char)iVar6 == '\x05') {
      uVar9 = 0x10000;
    }
    if ((uVar9 & 0x10000) != 0) goto LAB_005bd2de;
  }
  else {
    if (aVar5 == cmd_exec_grant) goto LAB_005bc9c8;
    if (aVar5 != cmd_exec_check) {
      if (aVar5 == cmd_stop) {
        BaseTimeCoordinator::disconnect(in_stack_000000f0);
        goto LAB_005bd2de;
      }
      if (aVar5 == cmd_terminate_immediately) goto LAB_005bd2de;
      if (aVar5 == cmd_time_grant) {
LAB_005bcf00:
        bVar2 = false;
        iVar6 = (*(in_RDX->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])();
        if ((char)iVar6 == '\0') {
          bVar2 = true;
        }
        else if ((char)iVar6 == '\x05') {
          bVar2 = true;
        }
        if (bVar2) goto LAB_005bd2de;
      }
      else if (aVar5 != cmd_time_check) {
        if (aVar5 != cmd_request_current_time) {
          if (((uint)(aVar5 + ~(cmd_request_current_time|cmd_tick)) < 2) ||
             ((uint)(aVar5 + ~cmd_time_barrier_request) < 2)) {
            iVar6 = (*(in_RDX->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])
                              (in_RDX,in_RSI);
            if (((char)iVar6 != '\0') && (bVar1 == 0)) {
              if (in_CL == '\x01') {
                ActionMessage::setAction(in_RSI,cmd_exec_check);
              }
              if (in_CL == '\x02') {
                ActionMessage::setAction(in_RSI,cmd_time_check);
              }
            }
            goto LAB_005bd2de;
          }
          if ((((uint)(aVar5 + ~(cmd_remove_publication|cmd_disconnect)) < 2) ||
              ((uint)(aVar5 + ~(cmd_add_dependency|cmd_disconnect)) < 2)) ||
             ((uint)(aVar5 + ~(cmd_add_dependent|cmd_disconnect)) < 2)) {
            bVar2 = GlobalFederateId::operator==(&in_RSI->dest_id,in_R9D);
            if (bVar2) {
              BaseTimeCoordinator::processDependencyUpdateMessage
                        ((BaseTimeCoordinator *)
                         CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                         in_stack_ffffffffffffff18);
            }
            goto LAB_005bd2de;
          }
          if (aVar5 != cmd_timing_info) {
            if (aVar5 != cmd_time_request) {
              if (aVar5 == cmd_force_time_grant) {
                in_stack_fffffffffffffef0 = &in_RSI->actionTime;
                local_88.internalTimeCode = (baseType)TimeCoordinator::getGrantedTime(in_RDX);
                bVar2 = TimeRepresentation<count_time<9,_long>_>::operator<
                                  (in_stack_fffffffffffffef0,&local_88);
                if (!bVar2) {
                  (*(in_RDX->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])(in_RDX,in_RSI)
                  ;
                }
              }
              else if (aVar5 == cmd_user_return) {
                std::this_thread::get_id();
                std::hash<std::thread::id>::operator()
                          ((hash<std::thread::id> *)in_stack_fffffffffffffee0,
                           in_stack_fffffffffffffed8);
              }
              else if (aVar5 == cmd_disconnect_fed_ack) {
                bVar2 = GlobalFederateId::operator==(&in_RSI->dest_id,in_R9D);
                if (bVar2) {
                  local_64 = 0;
                  bVar2 = GlobalFederateId::operator==(&in_RSI->source_id,(GlobalBrokerId)0x0);
                  if (((bVar2) && (in_CL != '\x05')) && (in_CL != '\x03')) {
                    BaseTimeCoordinator::disconnect(in_stack_000000f0);
                  }
                }
              }
              else if (((aVar5 == cmd_error) || (aVar5 == cmd_local_error)) ||
                      (aVar5 == cmd_global_error)) {
                aVar5 = ActionMessage::action(in_RSI);
                if ((aVar5 != cmd_global_error) &&
                   (bVar3 = GlobalFederateId::operator==(&in_RSI->source_id,in_R9D), !bVar3)) {
                  local_90 = 0;
                  bVar3 = GlobalFederateId::operator==(&in_RSI->source_id,(GlobalBrokerId)0x0);
                  if (!bVar3) {
                    local_94 = 1;
                    bVar3 = GlobalFederateId::operator==(&in_RSI->source_id,(GlobalBrokerId)0x1);
                    if ((!bVar3) &&
                       (bVar3 = GlobalFederateId::operator!=(&in_RSI->dest_id,in_R9D), !bVar3)) {
                      iVar6 = (*(in_RDX->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])();
                      in_stack_fffffffffffffeef = (char)iVar6;
                      if (in_stack_fffffffffffffeef == '\0') {
                        bVar2 = true;
                      }
                      else if (in_stack_fffffffffffffeef == '\x05') {
                        bVar2 = true;
                      }
                      if (((in_CL == '\x02') && (!bVar2)) && (bVar1 == 0)) {
                        memset(local_9c,0,4);
                        GlobalFederateId::GlobalFederateId(local_9c);
                        MVar4 = TimeCoordinator::checkTimeGrant
                                          ((TimeCoordinator *)
                                           CONCAT44(in_stack_ffffffffffffffac.gid,
                                                    in_stack_ffffffffffffffa8.gid),
                                           in_stack_ffffffffffffffb0);
                        returnableResult(MVar4);
                        in_stack_fffffffffffffee0 = in_RDX;
                      }
                      goto LAB_005bd2de;
                    }
                  }
                }
                if (((in_CL != '\x05') && (in_CL != '\x03')) &&
                   (aVar5 = ActionMessage::action(in_RSI), aVar5 != cmd_global_error)) {
                  TimeCoordinator::localError
                            ((TimeCoordinator *)
                             CONCAT17(state,CONCAT16(timeGranted_mode,in_stack_00000100)));
                }
              }
              goto LAB_005bd2de;
            }
            goto LAB_005bcf00;
          }
        }
        (*(in_RDX->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])(in_RDX,in_RSI);
        goto LAB_005bd2de;
      }
      if (in_CL == '\x02') {
        if (bVar1 == 0) {
          aVar5 = ActionMessage::action(in_RSI);
          if (aVar5 == cmd_time_request) {
            local_7c.gid = (in_RSI->source_id).gid;
          }
          else {
            memset(&local_7c,0,4);
            GlobalFederateId::GlobalFederateId(&local_7c);
          }
          MVar4 = TimeCoordinator::checkTimeGrant
                            ((TimeCoordinator *)
                             CONCAT44(in_stack_ffffffffffffffac.gid,in_stack_ffffffffffffffa8.gid),
                             in_stack_ffffffffffffffb0);
          returnableResult(MVar4);
        }
      }
      else if (in_CL == '\x01') {
        ActionMessage::setAction(in_RSI,cmd_exec_check);
      }
      goto LAB_005bd2de;
    }
  }
  if ((in_CL == '\x01') && (bVar1 == 0)) {
    aVar5 = ActionMessage::action(in_RSI);
    if (aVar5 != cmd_exec_request) {
      memset(&stack0xffffffffffffffac,0,4);
      GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xffffffffffffffac);
    }
    iVar6 = (*(in_RDX->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[9])();
    if ((((char)iVar6 == -2) && (aVar5 = ActionMessage::action(in_RSI), aVar5 == cmd_exec_grant)) &&
       (bVar2 = checkActionFlag<helics::ActionMessage,helics::TimingFlags>
                          (in_RSI,iteration_requested_flag), !bVar2)) {
      memset(&stack0xffffffffffffffa8,0,4);
      GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xffffffffffffffa8);
      memset(&local_5c,0,4);
      GlobalFederateId::GlobalFederateId(&local_5c);
      TimeCoordinator::sendUpdatedExecRequest
                (in_stack_00000008,in_stack_00000014,in_stack_00000010,unaff_retaddr);
    }
  }
LAB_005bd2de:
  std::tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool>::
  tuple<helics::FederateStates_&,_helics::MessageProcessingResult_&,_bool_&,_true,_true>
            ((tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> *)
             in_stack_fffffffffffffef0,
             (FederateStates *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
             (MessageProcessingResult *)in_stack_fffffffffffffee0,(bool *)in_stack_fffffffffffffed8)
  ;
  return (tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool>)in_EDI;
}

Assistant:

std::tuple<FederateStates, MessageProcessingResult, bool>
    processCoordinatorMessage(ActionMessage& cmd,
                              TimeCoordinator* timeCoord,
                              const FederateStates state,
                              const bool timeGranted_mode,
                              const GlobalFederateId localID)
{
    FederateStates newState{state};
    bool newMode{timeGranted_mode};
    MessageProcessingResult proc{MessageProcessingResult::CONTINUE_PROCESSING};
    bool returnable{false};
    switch (cmd.action()) {
        case CMD_IGNORE:
        default:
            break;
        case CMD_USER_RETURN: {
            auto tidHash = std::hash<std::thread::id>{}(std::this_thread::get_id());
            auto tid = static_cast<std::int32_t>(tidHash);
            if (tid == cmd.messageID) {
                proc = MessageProcessingResult::USER_RETURN;
            }

        } break;
        case CMD_TIME_BLOCK:
        case CMD_TIME_BARRIER:
        case CMD_TIME_BARRIER_CLEAR:
        case CMD_TIME_UNBLOCK: {
            auto processed = timeCoord->processTimeMessage(cmd);
            if (processed != TimeProcessingResult::NOT_PROCESSED) {
                if (!timeGranted_mode) {
                    if (state == FederateStates::INITIALIZING) {
                        cmd.setAction(CMD_EXEC_CHECK);
                        proc = MessageProcessingResult::REPROCESS_MESSAGE;
                    }
                    if (state == FederateStates::EXECUTING) {
                        cmd.setAction(CMD_TIME_CHECK);
                        proc = MessageProcessingResult::REPROCESS_MESSAGE;
                    }
                }
            }
            break;
        }
        case CMD_INIT_GRANT:
            if (state == FederateStates::CREATED) {
                if (checkActionFlag(cmd, observer_flag) ||
                    checkActionFlag(cmd, dynamic_join_flag)) {
                    timeCoord->setDynamicJoining();
                }
                if (checkActionFlag(cmd, iteration_requested_flag)) {
                    newState = FederateStates::CREATED;
                    newMode = false;
                    proc = MessageProcessingResult::ITERATING;
                } else {
                    newState = FederateStates::INITIALIZING;
                    newMode = true;
                    proc = MessageProcessingResult::NEXT_STEP;
                }
            }
            break;
        case CMD_EXEC_REQUEST:
            if ((cmd.source_id == localID) &&
                checkActionFlag(cmd, indicator_flag)) {  // this sets up a time request
                IterationRequest iterate = IterationRequest::NO_ITERATIONS;
                if (checkActionFlag(cmd, iteration_requested_flag)) {
                    iterate = (checkActionFlag(cmd, required_flag)) ?
                        IterationRequest::FORCE_ITERATION :
                        IterationRequest::ITERATE_IF_NEEDED;
                }
                timeCoord->enteringExecMode(iterate);
                newMode = false;
                break;
            }
            [[fallthrough]];
        case CMD_EXEC_GRANT: {
            bool processed = false;
            switch (timeCoord->processTimeMessage(cmd)) {
                case TimeProcessingResult::DELAY_PROCESSING:
                    proc = MessageProcessingResult::DELAY_MESSAGE;
                    processed = true;
                    break;
                case TimeProcessingResult::NOT_PROCESSED:
                    proc = MessageProcessingResult::CONTINUE_PROCESSING;
                    processed = true;
                    break;
                default:
                    break;
            }
            if (processed) {
                break;
            }
        }
            [[fallthrough]];
        case CMD_EXEC_CHECK:  // just check the time for entry
        {
            if (state != FederateStates::INITIALIZING) {
                break;
            }
            if (!timeGranted_mode) {
                auto grant = timeCoord->checkExecEntry(
                    cmd.action() == CMD_EXEC_REQUEST ? cmd.source_id : GlobalFederateId{});
                switch (grant) {
                    case MessageProcessingResult::ITERATING:
                        newMode = true;
                        // returnable = true;
                        proc = grant;
                        break;
                    case MessageProcessingResult::NEXT_STEP:
                        newState = FederateStates::EXECUTING;
                        newMode = true;
                        // returnable = true;
                        proc = grant;
                        break;
                    case MessageProcessingResult::CONTINUE_PROCESSING:
                        if (cmd.action() == CMD_EXEC_GRANT &&
                            !checkActionFlag(cmd, iteration_requested_flag)) {
                            timeCoord->sendUpdatedExecRequest();
                        }
                        break;
                    default:
                        newMode = true;
                        // returnable = true;
                        proc = grant;
                        break;
                }
            }
        } break;
        case CMD_TERMINATE_IMMEDIATELY:
            newState = FederateStates::FINISHED;
            proc = MessageProcessingResult::HALTED;
            break;
        case CMD_STOP:
            newState = FederateStates::FINISHED;
            timeCoord->disconnect();
            proc = MessageProcessingResult::HALTED;
            break;
        case CMD_DISCONNECT_FED_ACK:
            if ((cmd.dest_id == localID) && (cmd.source_id == parent_broker_id)) {
                if ((state != FederateStates::FINISHED) && (state != FederateStates::TERMINATING)) {
                    timeCoord->disconnect();
                }
                newState = FederateStates::FINISHED;
                proc = MessageProcessingResult::HALTED;
            }
            break;
        case CMD_REQUEST_CURRENT_TIME:
        case CMD_TIMING_INFO:
            timeCoord->processTimeMessage(cmd);
            break;
        case CMD_DISCONNECT_FED:
        case CMD_DISCONNECT:
            if (cmd.source_id == localID) {
                if ((state != FederateStates::FINISHED) && (state != FederateStates::TERMINATING)) {
                    timeCoord->disconnect();
                    cmd.dest_id = parent_broker_id;
                    newState = FederateStates::TERMINATING;
                    proc = MessageProcessingResult::REPROCESS_MESSAGE;
                }
            } else {
                // returnable = false;
                switch (timeCoord->processTimeMessage(cmd)) {
                    case TimeProcessingResult::DELAY_PROCESSING:
                        // returnable = true;
                        proc = MessageProcessingResult::DELAY_MESSAGE;
                        break;
                    case TimeProcessingResult::NOT_PROCESSED:
                        // returnable = true;
                        proc = MessageProcessingResult::CONTINUE_PROCESSING;
                        break;
                    default:
                        break;
                }
                if (state != FederateStates::EXECUTING) {
                    break;
                }
                if (!timeGranted_mode) {
                    proc = timeCoord->checkTimeGrant();
                    if (returnableResult(proc)) {
                        newMode = true;
                    }
                }
            }
            break;
        case CMD_BROADCAST_DISCONNECT:
        case CMD_DISCONNECT_BROKER:
        case CMD_DISCONNECT_CORE:
            returnable = false;
            switch (timeCoord->processTimeMessage(cmd)) {
                case TimeProcessingResult::DELAY_PROCESSING:
                    returnable = true;
                    proc = MessageProcessingResult::DELAY_MESSAGE;
                    break;
                case TimeProcessingResult::NOT_PROCESSED:
                    proc = MessageProcessingResult::CONTINUE_PROCESSING;
                    returnable = true;
                    break;
                default:
                    break;
            }
            if (returnable) {
                break;
            }
            if (state != FederateStates::EXECUTING) {
                break;
            }
            if (!timeGranted_mode) {
                proc = timeCoord->checkTimeGrant();
                if (returnableResult(proc)) {
                    newMode = true;
                }
            }
            break;

        case CMD_TIME_REQUEST:
        case CMD_TIME_GRANT:
            returnable = false;
            switch (timeCoord->processTimeMessage(cmd)) {
                case TimeProcessingResult::DELAY_PROCESSING:
                    proc = MessageProcessingResult::DELAY_MESSAGE;
                    returnable = true;
                    break;
                case TimeProcessingResult::NOT_PROCESSED:
                    proc = MessageProcessingResult::CONTINUE_PROCESSING;
                    returnable = true;
                    break;
                default:
                    break;
            }
            if (returnable) {
                break;
            }
            [[fallthrough]];
        case CMD_TIME_CHECK:
            if (state != FederateStates::EXECUTING) {
                if (state == FederateStates::INITIALIZING) {
                    cmd.setAction(CMD_EXEC_CHECK);
                    proc = MessageProcessingResult::REPROCESS_MESSAGE;
                }

                break;
            }
            if (!timeGranted_mode) {
                proc = timeCoord->checkTimeGrant(
                    cmd.action() == CMD_TIME_REQUEST ? cmd.source_id : GlobalFederateId{});
                if (returnableResult(proc)) {
                    newMode = true;
                }
            }
            break;
        case CMD_FORCE_TIME_GRANT: {
            if (cmd.actionTime < timeCoord->getGrantedTime()) {
                break;
            }
            timeCoord->processTimeMessage(cmd);
            newMode = true;
            proc = MessageProcessingResult::NEXT_STEP;
            break;
        }

        case CMD_ERROR:
        case CMD_LOCAL_ERROR:
        case CMD_GLOBAL_ERROR:
            if (cmd.action() == CMD_GLOBAL_ERROR || cmd.source_id == localID ||
                cmd.source_id == parent_broker_id || cmd.source_id == gRootBrokerID ||
                cmd.dest_id != localID) {
                if ((state != FederateStates::FINISHED) && (state != FederateStates::TERMINATING)) {
                    if (cmd.action() != CMD_GLOBAL_ERROR) {
                        timeCoord->localError();
                    }
                    newState = FederateStates::ERRORED;
                    proc = MessageProcessingResult::ERROR_RESULT;
                }
            } else {
                switch (timeCoord->processTimeMessage(cmd)) {
                    case TimeProcessingResult::DELAY_PROCESSING:
                        returnable = true;
                        proc = MessageProcessingResult::DELAY_MESSAGE;
                        break;
                    case TimeProcessingResult::NOT_PROCESSED:
                        returnable = true;
                        proc = MessageProcessingResult::CONTINUE_PROCESSING;
                        break;
                    default:
                        break;
                }
                if (state != FederateStates::EXECUTING) {
                    break;
                }
                if (returnable) {
                    break;
                }
                if (!timeGranted_mode) {
                    proc = timeCoord->checkTimeGrant();
                    if (returnableResult(proc)) {
                        newMode = true;
                    }
                }
            }
            break;
        case CMD_ADD_DEPENDENCY:
        case CMD_REMOVE_DEPENDENCY:
        case CMD_ADD_DEPENDENT:
        case CMD_REMOVE_DEPENDENT:
        case CMD_ADD_INTERDEPENDENCY:
        case CMD_REMOVE_INTERDEPENDENCY:
            if (cmd.dest_id == localID) {
                timeCoord->processDependencyUpdateMessage(cmd);
            }

            break;
    }
    return {newState, proc, newMode};
}